

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O3

void uv_sem_post(uv_sem_t *sem)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  uv_semaphore_t *sem_1;
  
  if (platform_needs_custom_semaphore == 0) {
    iVar1 = sem_post((sem_t *)sem);
  }
  else {
    __mutex = (pthread_mutex_t *)sem->__align;
    iVar1 = pthread_mutex_lock(__mutex);
    if (iVar1 != 0) goto LAB_001ef475;
    iVar1 = *(int *)((long)__mutex + 0x58);
    *(int *)((long)__mutex + 0x58) = iVar1 + 1;
    if (iVar1 == 0) {
      iVar1 = pthread_cond_signal((pthread_cond_t *)(__mutex + 1));
      if (iVar1 != 0) goto LAB_001ef475;
    }
    iVar1 = pthread_mutex_unlock(__mutex);
  }
  if (iVar1 == 0) {
    return;
  }
LAB_001ef475:
  abort();
}

Assistant:

void uv_sem_post(uv_sem_t* sem) {
  if (platform_needs_custom_semaphore)
    uv__custom_sem_post(sem);
  else
    uv__sem_post(sem);
}